

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

int count_ncateg_in_col(int *x,size_t n,int ncat,uchar *buffer)

{
  int iVar1;
  ulong uVar2;
  size_t ix;
  size_t sVar3;
  ulong uVar4;
  
  memset(buffer,0,(long)ncat);
  for (sVar3 = 0; n != sVar3; sVar3 = sVar3 + 1) {
    if (-1 < (long)x[sVar3]) {
      buffer[x[sVar3]] = '\x01';
    }
  }
  uVar2 = 0;
  uVar4 = (ulong)(uint)ncat;
  if (ncat < 1) {
    uVar4 = uVar2;
  }
  iVar1 = 0;
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    iVar1 = iVar1 + (uint)buffer[uVar2];
  }
  return iVar1;
}

Assistant:

int count_ncateg_in_col(const int x[], const size_t n, const int ncat, unsigned char buffer[])
{
    memset(buffer, 0, ncat*sizeof(char));
    for (size_t ix = 0; ix < n; ix++)
    {
        if (likely(x[ix] >= 0)) buffer[x[ix]] = true;
    }

    int ncat_present = 0;
    for (int cat = 0; cat < ncat; cat++)
        ncat_present += buffer[cat];
    return ncat_present;
}